

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void iterates_clear(CUPDLPiterates *iterates)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x40) != 0) {
      vec_clear((CUPDLPvec *)0x802e78);
    }
    if (*(long *)((long)in_RDI + 0x48) != 0) {
      vec_clear((CUPDLPvec *)0x802e90);
    }
    if (*(long *)((long)in_RDI + 0x50) != 0) {
      vec_clear((CUPDLPvec *)0x802ea8);
    }
    if (*(long *)((long)in_RDI + 0x58) != 0) {
      vec_clear((CUPDLPvec *)0x802ec0);
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
      *(undefined8 *)((long)in_RDI + 0x20) = 0;
    }
    if (*(long *)((long)in_RDI + 0x28) != 0) {
      free(*(void **)((long)in_RDI + 0x28));
      *(undefined8 *)((long)in_RDI + 0x28) = 0;
    }
    if (*(long *)((long)in_RDI + 0x80) != 0) {
      vec_clear((CUPDLPvec *)0x802f26);
    }
    if (*(long *)((long)in_RDI + 0x88) != 0) {
      vec_clear((CUPDLPvec *)0x802f44);
    }
    if (*(long *)((long)in_RDI + 0x30) != 0) {
      free(*(void **)((long)in_RDI + 0x30));
      *(undefined8 *)((long)in_RDI + 0x30) = 0;
    }
    if (*(long *)((long)in_RDI + 0x38) != 0) {
      free(*(void **)((long)in_RDI + 0x38));
      *(undefined8 *)((long)in_RDI + 0x38) = 0;
    }
    if (*(long *)((long)in_RDI + 0x60) != 0) {
      vec_clear((CUPDLPvec *)0x802fa4);
    }
    if (*(long *)((long)in_RDI + 0x68) != 0) {
      vec_clear((CUPDLPvec *)0x802fbc);
    }
    if (*(long *)((long)in_RDI + 0x90) != 0) {
      vec_clear((CUPDLPvec *)0x802fda);
    }
    if (*(long *)((long)in_RDI + 0x70) != 0) {
      vec_clear((CUPDLPvec *)0x802ff2);
    }
    if (*(long *)((long)in_RDI + 0x78) != 0) {
      vec_clear((CUPDLPvec *)0x80300a);
    }
    if (*(long *)((long)in_RDI + 0x98) != 0) {
      vec_clear((CUPDLPvec *)0x803028);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void iterates_clear(CUPDLPiterates *iterates) {
  if (iterates) {
    if (iterates->x[0]) {
      // CUPDLP_FREE_VEC(iterates->x[0]);
      vec_clear(iterates->x[0]);
    }
    if (iterates->x[1]) {
      // CUPDLP_FREE_VEC(iterates->x[1]);
      vec_clear(iterates->x[1]);
    }
    if (iterates->y[0]) {
      // CUPDLP_FREE_VEC(iterates->y[0]);
      vec_clear(iterates->y[0]);
    }
    if (iterates->y[1]) {
      // CUPDLP_FREE_VEC(iterates->y[1]);
      vec_clear(iterates->y[1]);
    }
    if (iterates->xSum) {
      CUPDLP_FREE_VEC(iterates->xSum);
    }
    if (iterates->ySum) {
      CUPDLP_FREE_VEC(iterates->ySum);
    }
    if (iterates->xAverage) {
      // CUPDLP_FREE_VEC(iterates->xAverage);
      vec_clear(iterates->xAverage);
    }
    if (iterates->yAverage) {
      // CUPDLP_FREE_VEC(iterates->yAverage);
      vec_clear(iterates->yAverage);
    }
    if (iterates->xLastRestart) {
      CUPDLP_FREE_VEC(iterates->xLastRestart);
    }
    if (iterates->yLastRestart) {
      CUPDLP_FREE_VEC(iterates->yLastRestart);
    }
    if (iterates->ax[0]) {
      // CUPDLP_FREE_VEC(iterates->ax[0]);
      vec_clear(iterates->ax[0]);
    }
    if (iterates->ax[1]) {
      // CUPDLP_FREE_VEC(iterates->ax[1]);
      vec_clear(iterates->ax[1]);
    }
    if (iterates->axAverage) {
      // CUPDLP_FREE_VEC(iterates->axAverage);
      vec_clear(iterates->axAverage);
    }
    if (iterates->aty[0]) {
      // CUPDLP_FREE_VEC(iterates->aty[0]);
      vec_clear(iterates->aty[0]);
    }
    if (iterates->aty[1]) {
      // CUPDLP_FREE_VEC(iterates->aty[1]);
      vec_clear(iterates->aty[1]);
    }
    if (iterates->atyAverage) {
      // CUPDLP_FREE_VEC(iterates->atyAverage);
      vec_clear(iterates->atyAverage);
    }
    cupdlp_free(iterates);
  }
}